

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

void Curl_flush_cookies(Curl_easy *data,int cleanup)

{
  CookieInfo *cookies;
  byte *__filename;
  curl_slist *list;
  FILE *__stream;
  void *__base;
  long lVar1;
  char *pcVar2;
  Cookie *pCVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  if ((data->set).str[5] == (char *)0x0) {
    if ((cleanup != 0) && (list = (data->change).cookielist, list != (curl_slist *)0x0)) {
      curl_slist_free_all(list);
      (data->change).cookielist = (curl_slist *)0x0;
    }
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
    goto LAB_0010f544;
  }
  if ((data->change).cookielist != (curl_slist *)0x0) {
    Curl_cookie_loadfiles(data);
  }
  Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  cookies = data->cookies;
  __filename = (byte *)(data->set).str[5];
  remove_expired(cookies);
  uVar4 = *__filename - 0x2d;
  if (uVar4 == 0) {
    uVar4 = (uint)__filename[1];
  }
  __stream = _stdout;
  if ((uVar4 == 0) || (__stream = fopen64((char *)__filename,"w"), __stream != (FILE *)0x0)) {
    fputs("# Netscape HTTP Cookie File\n# https://curl.haxx.se/docs/http-cookies.html\n# This file was generated by libcurl! Edit at your own risk.\n\n"
          ,__stream);
    if (cookies->numcookies != 0) {
      __base = (*Curl_cmalloc)(cookies->numcookies << 3);
      if (__base == (void *)0x0) {
        if (uVar4 != 0) {
LAB_0010f524:
          fclose(__stream);
        }
        goto LAB_0010f52c;
      }
      lVar1 = 0;
      uVar5 = 0;
      do {
        for (pCVar3 = cookies->cookies[lVar1]; pCVar3 != (Cookie *)0x0; pCVar3 = pCVar3->next) {
          if (pCVar3->domain != (char *)0x0) {
            uVar6 = (ulong)uVar5;
            uVar5 = uVar5 + 1;
            *(Cookie **)((long)__base + uVar6 * 8) = pCVar3;
          }
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x100);
      qsort(__base,cookies->numcookies,8,cookie_sort_ct);
      if (uVar5 != 0) {
        uVar6 = 0;
        do {
          pcVar2 = get_netscape_format(*(Cookie **)((long)__base + uVar6 * 8));
          if (pcVar2 == (char *)0x0) {
            curl_mfprintf((FILE *)__stream,"#\n# Fatal libcurl error\n");
            (*Curl_cfree)(__base);
            if (uVar4 == 0) goto LAB_0010f52c;
            goto LAB_0010f524;
          }
          curl_mfprintf((FILE *)__stream,"%s\n",pcVar2);
          (*Curl_cfree)(pcVar2);
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      (*Curl_cfree)(__base);
    }
    if (uVar4 != 0) {
      fclose(__stream);
    }
  }
  else {
LAB_0010f52c:
    Curl_infof(data,"WARNING: failed to save cookies in %s\n",(data->set).str[5]);
  }
LAB_0010f544:
  if (cleanup != 0) {
    if ((data->share == (Curl_share *)0x0) || (data->cookies != data->share->cookies)) {
      Curl_cookie_cleanup(data->cookies);
    }
  }
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return;
}

Assistant:

void Curl_flush_cookies(struct Curl_easy *data, int cleanup)
{
  if(data->set.str[STRING_COOKIEJAR]) {
    if(data->change.cookielist) {
      /* If there is a list of cookie files to read, do it first so that
         we have all the told files read before we write the new jar.
         Curl_cookie_loadfiles() LOCKS and UNLOCKS the share itself! */
      Curl_cookie_loadfiles(data);
    }

    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);

    /* if we have a destination file for all the cookies to get dumped to */
    if(cookie_output(data->cookies, data->set.str[STRING_COOKIEJAR]))
      infof(data, "WARNING: failed to save cookies in %s\n",
            data->set.str[STRING_COOKIEJAR]);
  }
  else {
    if(cleanup && data->change.cookielist) {
      /* since nothing is written, we can just free the list of cookie file
         names */
      curl_slist_free_all(data->change.cookielist); /* clean up list */
      data->change.cookielist = NULL;
    }
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  }

  if(cleanup && (!data->share || (data->cookies != data->share->cookies))) {
    Curl_cookie_cleanup(data->cookies);
  }
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
}